

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical_cast.h
# Opt level: O1

Time * Fixpp::details::LexicalCast<Fixpp::Type::UTCTimeOnly>::cast
                 (Time *__return_storage_ptr__,char *offset,size_t size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  _Optional_payload_base<int> _Var7;
  runtime_error *prVar8;
  ulong uVar9;
  ulong uVar10;
  StreamCursor local_90;
  RawStreamBuf<char> buf;
  anon_class_8_1_50ba0494 local_40;
  anon_class_8_1_50ba0494 parseFragment;
  StreamCursor cursor;
  
  buf.super_StreamBuf<char>._56_8_ = __assert_fail;
  local_90.buf = (StreamBuf<char> *)__assert_fail;
  buf.super_StreamBuf<char>.super_basic_streambuf<char,_std::char_traits<char>_> =
       (basic_streambuf<char,_std::char_traits<char>_>)0x0;
  buf.super_StreamBuf<char>._1_7_ = 0;
  buf.super_StreamBuf<char>._8_8_ = 0;
  buf.super_StreamBuf<char>._16_8_ = 0;
  buf.super_StreamBuf<char>._24_8_ = 0;
  buf.super_StreamBuf<char>._32_8_ = 0;
  buf.super_StreamBuf<char>._40_8_ = 0;
  std::locale::locale((locale *)&buf.super_StreamBuf<char>.field_0x30);
  local_90.buf = (StreamBuf<char> *)&PTR__streambuf_00ad9d98;
  buf.super_StreamBuf<char>._16_8_ = offset + size;
  parseFragment.cursor = &local_90;
  buf.super_StreamBuf<char>._0_8_ = offset;
  buf.super_StreamBuf<char>._8_8_ = offset;
  StreamCursor::advance((StreamCursor *)&parseFragment,0);
  local_40.cursor = (StreamCursor *)&parseFragment;
  iVar2 = cast::anon_class_8_1_50ba0494::operator()
                    (&local_40,2,"Could not parse hours from UTCTimeOnly");
  bVar1 = StreamCursor::advance((StreamCursor *)&parseFragment,1);
  if (!bVar1) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar8,"Could not parse minutes from UTCTimeOnly, expected \':\' got EOF");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = cast::anon_class_8_1_50ba0494::operator()
                    (&local_40,2,"Could not parse minutes from UTCTimeOnly");
  bVar1 = StreamCursor::advance((StreamCursor *)&parseFragment,1);
  if (!bVar1) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar8,"Could not parse seconds from UTCTimeOnly, expected \':\' got EOF");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = cast::anon_class_8_1_50ba0494::operator()
                    (&local_40,2,"Could not parse seconds from UTCTimeOnly");
  if (parseFragment.cursor[3].buf == parseFragment.cursor[2].buf) {
    lVar6 = (**(code **)&(parseFragment.cursor)->buf->field_0x38)();
    if (lVar6 != 0) goto LAB_008d6b85;
    uVar10 = 0;
    uVar9 = 0;
  }
  else {
LAB_008d6b85:
    StreamCursor::advance((StreamCursor *)&parseFragment,1);
    uVar5 = cast::anon_class_8_1_50ba0494::operator()
                      (&local_40,3,"Could not parse milliseconds from UTCTimeOnly");
    uVar10 = (ulong)uVar5;
    uVar9 = 0x100000000;
  }
  if (parseFragment.cursor[3].buf == parseFragment.cursor[2].buf) {
    lVar6 = (**(code **)&(parseFragment.cursor)->buf->field_0x38)();
    if (lVar6 == 0) {
      _Var7._M_payload = (_Storage<int,_true>)0x0;
      _Var7._M_engaged = false;
      _Var7._5_3_ = 0;
      goto LAB_008d6bf2;
    }
  }
  uVar5 = cast::anon_class_8_1_50ba0494::operator()
                    (&local_40,3,"Could not parse microseconds from UTCTimeOnly");
  _Var7 = (_Optional_payload_base<int>)((ulong)uVar5 | 0x100000000);
LAB_008d6bf2:
  __return_storage_ptr__->m_time = (long)iVar4 + (long)(iVar3 * 0x3c) + (long)(iVar2 * 0xe10);
  (__return_storage_ptr__->m_msec).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = (_Optional_payload_base<int>)(uVar9 | uVar10);
  (__return_storage_ptr__->m_usec).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = _Var7;
  local_90.buf = (StreamBuf<char> *)buf.super_StreamBuf<char>._56_8_;
  std::locale::~locale((locale *)&buf.super_StreamBuf<char>.field_0x30);
  return __return_storage_ptr__;
}

Assistant:

static Type::UTCTimeOnly::Time cast(const char* offset, size_t size)
            {
                RawStreamBuf<> buf(const_cast<char *>(offset), size);
                StreamCursor cursor(&buf);

                const auto parseFragment = [&](size_t size, const char* error)
                {
                    int value;
                    if (!match_int_fast_n(&value, cursor, size))
                        throw std::runtime_error(error);
                    return value;
                };

                const int hour = parseFragment(2, "Could not parse hours from UTCTimeOnly");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse minutes from UTCTimeOnly, expected ':' got EOF");

                const int min = parseFragment(2, "Could not parse minutes from UTCTimeOnly");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse seconds from UTCTimeOnly, expected ':' got EOF");

                const int sec = parseFragment(2, "Could not parse seconds from UTCTimeOnly");

                std::optional<int> msec;
                if (!cursor.eof())
                {
                    // Literal('.')
                    cursor.advance(1);
                    msec = parseFragment(3, "Could not parse milliseconds from UTCTimeOnly");
                }

                std::optional<int> usec;
                if (!cursor.eof())
                {
                    usec = parseFragment(3, "Could not parse microseconds from UTCTimeOnly");
                }

                std::tm tm{};
                tm.tm_hour = hour;
                tm.tm_min = min;
                tm.tm_sec = sec;

                return {mkgmtime(&tm), msec, usec};
            }